

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::Update
          (ChLinkRevoluteTranslational *this,double time,bool update_assets)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChVector<double> *pCVar13;
  Scalar *pSVar14;
  ChConstraintTwoBodies *pCVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 local_218 [16];
  variable_if_dynamic<long,__1> local_208;
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined8 local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined8 local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  ChVector<double> *local_1b8;
  ChVector<double> *local_1b0;
  uint local_1a8;
  uint uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ChVector<double> Phi_pi1;
  ChVector<double> z1_2;
  ChVector<double> z1_abs;
  ChVector<double> Phi_pi2;
  ChVector<double> d12_2;
  ChVector<double> d12_1;
  ChVector<double> y2_1;
  ChVector<double> x2_1;
  ChVector<double> x2_abs;
  ChVector<double> v;
  ChVector<double> p2_abs;
  ChVector<double> p1_abs;
  ChVector<double> y2_abs;
  
  ChLink::UpdateTime(&this->super_ChLink,time);
  local_1c8 = &this->m_p1;
  ChFrame<double>::TransformPointLocalToParent
            (&p1_abs,(ChFrame<double> *)(this->super_ChLink).Body1,local_1c8);
  local_1b8 = &this->m_p2;
  ChFrame<double>::TransformPointLocalToParent
            (&p2_abs,(ChFrame<double> *)(this->super_ChLink).Body2,local_1b8);
  local_1d8 = &this->m_z1;
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,local_1d8);
  local_1b0 = &this->m_x2;
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,local_1b0);
  local_1f8 = &this->m_y2;
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,local_1f8);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = x2_abs.m_data[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = x2_abs.m_data[2];
  auVar17._4_4_ = z1_abs.m_data[0]._4_4_;
  auVar17._0_4_ = z1_abs.m_data[0]._0_4_;
  auVar17._8_8_ = 0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = z1_abs.m_data[2];
  v.m_data._0_16_ =
       vsubpd_avx((undefined1  [16])p2_abs.m_data._0_16_,(undefined1  [16])p1_abs.m_data._0_16_);
  v.m_data[2] = p2_abs.m_data[2] - p1_abs.m_data[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = z1_abs.m_data[1] * x2_abs.m_data[1];
  auVar3 = vfmadd231sd_fma(auVar21,auVar17,auVar20);
  auVar3 = vfmadd231sd_fma(auVar3,auVar23,auVar24);
  this->m_cur_par1 = auVar3._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = y2_abs.m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = z1_abs.m_data[1] * y2_abs.m_data[1];
  auVar3 = vfmadd231sd_fma(auVar22,auVar17,auVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = y2_abs.m_data[2];
  auVar3 = vfmadd231sd_fma(auVar3,auVar23,auVar2);
  this->m_cur_par2 = auVar3._0_8_;
  auVar3 = vshufpd_avx((undefined1  [16])v.m_data._0_16_,(undefined1  [16])v.m_data._0_16_,1);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar3._0_8_ * z1_abs.m_data[1];
  auVar2 = vfmadd231sd_fma(auVar18,(undefined1  [16])v.m_data._0_16_,auVar17);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = v.m_data[2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar16,auVar23);
  this->m_cur_dot = auVar2._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar3._0_8_ * x2_abs.m_data[1];
  auVar3 = vfmadd231sd_fma(auVar19,(undefined1  [16])v.m_data._0_16_,auVar20);
  auVar3 = vfmadd231sd_fma(auVar3,auVar16,auVar24);
  this->m_cur_dist = auVar3._0_8_;
  ChFrame<double>::TransformDirectionParentToLocal
            (&z1_2,(ChFrame<double> *)(this->super_ChLink).Body2,&z1_abs);
  ChFrame<double>::TransformDirectionParentToLocal
            (&x2_1,(ChFrame<double> *)(this->super_ChLink).Body1,&x2_abs);
  ChFrame<double>::TransformDirectionParentToLocal
            (&y2_1,(ChFrame<double> *)(this->super_ChLink).Body1,&y2_abs);
  ChFrame<double>::TransformDirectionParentToLocal
            (&d12_1,(ChFrame<double> *)(this->super_ChLink).Body1,&v);
  ChFrame<double>::TransformDirectionParentToLocal
            (&d12_2,(ChFrame<double> *)(this->super_ChLink).Body2,&v);
  pCVar13 = local_1d8;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = this->m_cur_par1;
  Vcross<double,double>(local_1d8,&x2_1);
  pCVar15 = &this->m_cnstr_par1;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  *pSVar14 = 0.0;
  local_1e8._0_4_ = SUB84(Phi_pi1.m_data[0],0);
  local_1e8._4_4_ = (uint)((ulong)Phi_pi1.m_data[0] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = (Scalar)CONCAT44(local_1e8._4_4_,(uint)local_1e8);
  local_1e8._0_4_ = SUB84(Phi_pi1.m_data[1],0);
  local_1e8._4_4_ = (uint)((ulong)Phi_pi1.m_data[1] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = (Scalar)CONCAT44(local_1e8._4_4_,(uint)local_1e8);
  local_1e8._0_4_ = SUB84(Phi_pi1.m_data[2],0);
  local_1e8._4_4_ = (uint)((ulong)Phi_pi1.m_data[2] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  *pSVar14 = (Scalar)CONCAT44(local_1e8._4_4_,(uint)local_1e8);
  Vcross<double,double>(local_1b0,&z1_2);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  *pSVar14 = 0.0;
  local_1e8 = Phi_pi2.m_data[0];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = local_1e8;
  local_1e8 = Phi_pi2.m_data[1];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = local_1e8;
  local_1e8 = Phi_pi2.m_data[2];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  *pSVar14 = local_1e8;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
       = this->m_cur_par2;
  Vcross<double,double>(pCVar13,&y2_1);
  pCVar15 = &this->m_cnstr_par2;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  *pSVar14 = 0.0;
  local_1e8._0_4_ = SUB84(Phi_pi1.m_data[0],0);
  local_1e8._4_4_ = (uint)((ulong)Phi_pi1.m_data[0] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = (Scalar)CONCAT44(local_1e8._4_4_,(uint)local_1e8);
  local_1e8._0_4_ = SUB84(Phi_pi1.m_data[1],0);
  local_1e8._4_4_ = (uint)((ulong)Phi_pi1.m_data[1] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = (Scalar)CONCAT44(local_1e8._4_4_,(uint)local_1e8);
  local_1e8._0_4_ = SUB84(Phi_pi1.m_data[2],0);
  local_1e8._4_4_ = (uint)((ulong)Phi_pi1.m_data[2] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  *pSVar14 = (Scalar)CONCAT44(local_1e8._4_4_,(uint)local_1e8);
  Vcross<double,double>(local_1f8,&z1_2);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  *pSVar14 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  *pSVar14 = 0.0;
  local_1f8 = (ChVector<double> *)Phi_pi2.m_data[0];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = (Scalar)local_1f8;
  local_1f8 = (ChVector<double> *)Phi_pi2.m_data[1];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = (Scalar)local_1f8;
  local_1f8 = (ChVector<double> *)Phi_pi2.m_data[2];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  pCVar13 = local_1d8;
  *pSVar14 = (Scalar)local_1f8;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
       = this->m_cur_dot;
  Vcross<double,double>(local_1d8,&d12_1);
  Vcross<double,double>(local_1c8,pCVar13);
  local_198 = (double)local_218._0_8_ - Phi_pi1.m_data[0];
  local_1e8 = (double)local_218._8_8_ - Phi_pi1.m_data[1];
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0x80000000;
  uStack_1d0 = 0;
  uStack_1cc = 0x80000000;
  local_1f8 = (ChVector<double> *)((double)local_208.m_value - Phi_pi1.m_data[2]);
  pCVar15 = &this->m_cnstr_dot;
  uStack_1a4 = z1_abs.m_data[0]._4_4_ ^ 0x80000000;
  local_1a8 = z1_abs.m_data[0]._0_4_;
  uStack_1a0 = 0;
  uStack_19c = 0x80000000;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  auVar8._4_4_ = uStack_1a4;
  auVar8._0_4_ = local_1a8;
  auVar8._8_4_ = uStack_1a0;
  auVar8._12_4_ = uStack_19c;
  SVar1 = (Scalar)vmovlps_avx(auVar8);
  *pSVar14 = SVar1;
  local_1a8 = SUB84(z1_abs.m_data[1],0) ^ (uint)local_1d8;
  uStack_1a4 = (uint)((ulong)z1_abs.m_data[1] >> 0x20) ^ local_1d8._4_4_;
  uStack_1a0 = uStack_1d0;
  uStack_19c = uStack_1cc;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  auVar9._4_4_ = uStack_1a4;
  auVar9._0_4_ = local_1a8;
  auVar9._8_4_ = uStack_1a0;
  auVar9._12_4_ = uStack_19c;
  SVar1 = (Scalar)vmovlps_avx(auVar9);
  *pSVar14 = SVar1;
  local_1a8 = SUB84(z1_abs.m_data[2],0) ^ (uint)local_1d8;
  uStack_1a4 = (uint)((ulong)z1_abs.m_data[2] >> 0x20) ^ local_1d8._4_4_;
  uStack_1a0 = uStack_1d0;
  uStack_19c = uStack_1cc;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  auVar10._4_4_ = uStack_1a4;
  auVar10._0_4_ = local_1a8;
  auVar10._8_4_ = uStack_1a0;
  auVar10._12_4_ = uStack_19c;
  SVar1 = (Scalar)vmovlps_avx(auVar10);
  *pSVar14 = SVar1;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = local_198;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = local_1e8;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  *pSVar14 = (Scalar)local_1f8;
  Vcross<double,double>(local_1b8,&z1_2);
  local_1f8._0_4_ = z1_abs.m_data[0]._0_4_;
  local_1f8._4_4_ = z1_abs.m_data[0]._4_4_;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  *pSVar14 = (Scalar)CONCAT44(local_1f8._4_4_,(uint)local_1f8);
  local_1f8._0_4_ = SUB84(z1_abs.m_data[1],0);
  local_1f8._4_4_ = (uint)((ulong)z1_abs.m_data[1] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  *pSVar14 = (Scalar)CONCAT44(local_1f8._4_4_,(uint)local_1f8);
  local_1f8._0_4_ = SUB84(z1_abs.m_data[2],0);
  local_1f8._4_4_ = (uint)((ulong)z1_abs.m_data[2] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  *pSVar14 = (Scalar)CONCAT44(local_1f8._4_4_,(uint)local_1f8);
  local_1f8._0_4_ = SUB84(Phi_pi1.m_data[0],0);
  local_1f8._4_4_ = (uint)((ulong)Phi_pi1.m_data[0] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = (Scalar)CONCAT44(local_1f8._4_4_,(uint)local_1f8);
  local_1f8._0_4_ = SUB84(Phi_pi1.m_data[1],0);
  local_1f8._4_4_ = (uint)((ulong)Phi_pi1.m_data[1] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = (Scalar)CONCAT44(local_1f8._4_4_,(uint)local_1f8);
  local_1f8._0_4_ = SUB84(Phi_pi1.m_data[2],0);
  local_1f8._4_4_ = (uint)((ulong)Phi_pi1.m_data[2] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  *pSVar14 = (Scalar)CONCAT44(local_1f8._4_4_,(uint)local_1f8);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = this->m_cur_dist - this->m_dist;
  Vcross<double,double>(local_1c8,&x2_1);
  pCVar15 = &this->m_cnstr_dist;
  local_1e8._0_4_ = (uint)local_218._0_8_ ^ (uint)local_1d8;
  local_1e8._4_4_ = SUB84(local_218._0_8_,4) ^ local_1d8._4_4_;
  uStack_1e0 = uStack_1d0;
  uStack_1dc = uStack_1cc;
  local_1f8._0_4_ = (uint)local_218._8_8_ ^ (uint)local_1d8;
  local_1f8._4_4_ = SUB84(local_218._8_8_,4) ^ local_1d8._4_4_;
  uStack_1f0 = uStack_1d0;
  uStack_1ec = uStack_1cc;
  local_1c8._0_4_ = (uint)local_208.m_value ^ (uint)local_1d8;
  local_1c8._4_4_ = (uint)((ulong)local_208.m_value >> 0x20) ^ local_1d8._4_4_;
  uStack_1c0 = uStack_1d0;
  uStack_1bc = uStack_1cc;
  local_198._0_4_ = SUB84(x2_abs.m_data[0],0) ^ (uint)local_1d8;
  local_198._4_4_ = (uint)((ulong)x2_abs.m_data[0] >> 0x20) ^ local_1d8._4_4_;
  uStack_190 = uStack_1d0;
  uStack_18c = uStack_1cc;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  auVar11._4_4_ = local_198._4_4_;
  auVar11._0_4_ = (uint)local_198;
  auVar11._8_4_ = uStack_190;
  auVar11._12_4_ = uStack_18c;
  SVar1 = (Scalar)vmovlps_avx(auVar11);
  *pSVar14 = SVar1;
  local_198._0_4_ = SUB84(x2_abs.m_data[1],0) ^ (uint)local_1d8;
  local_198._4_4_ = (uint)((ulong)x2_abs.m_data[1] >> 0x20) ^ local_1d8._4_4_;
  uStack_190 = uStack_1d0;
  uStack_18c = uStack_1cc;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  auVar12._4_4_ = local_198._4_4_;
  auVar12._0_4_ = (uint)local_198;
  auVar12._8_4_ = uStack_190;
  auVar12._12_4_ = uStack_18c;
  SVar1 = (Scalar)vmovlps_avx(auVar12);
  *pSVar14 = SVar1;
  local_1d8._0_4_ = SUB84(x2_abs.m_data[2],0) ^ (uint)local_1d8;
  local_1d8._4_4_ = (uint)((ulong)x2_abs.m_data[2] >> 0x20) ^ local_1d8._4_4_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  auVar6._4_4_ = local_1d8._4_4_;
  auVar6._0_4_ = (uint)local_1d8;
  auVar6._8_4_ = uStack_1d0;
  auVar6._12_4_ = uStack_1cc;
  SVar1 = (Scalar)vmovlps_avx(auVar6);
  *pSVar14 = SVar1;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  auVar5._4_4_ = local_1e8._4_4_;
  auVar5._0_4_ = (uint)local_1e8;
  auVar5._8_4_ = uStack_1e0;
  auVar5._12_4_ = uStack_1dc;
  SVar1 = (Scalar)vmovlps_avx(auVar5);
  *pSVar14 = SVar1;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  auVar4._4_4_ = local_1f8._4_4_;
  auVar4._0_4_ = (uint)local_1f8;
  auVar4._8_4_ = uStack_1f0;
  auVar4._12_4_ = uStack_1ec;
  SVar1 = (Scalar)vmovlps_avx(auVar4);
  *pSVar14 = SVar1;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  pCVar13 = local_1b0;
  auVar7._4_4_ = local_1c8._4_4_;
  auVar7._0_4_ = (uint)local_1c8;
  auVar7._8_4_ = uStack_1c0;
  auVar7._12_4_ = uStack_1bc;
  SVar1 = (Scalar)vmovlps_avx(auVar7);
  *pSVar14 = SVar1;
  Vcross<double,double>(local_1b0,&d12_2);
  Vcross<double,double>(local_1b8,pCVar13);
  local_1b8 = (ChVector<double> *)((double)local_218._0_8_ + Phi_pi1.m_data[0]);
  local_1b0 = (ChVector<double> *)((double)local_218._8_8_ + Phi_pi1.m_data[1]);
  local_1c8._0_4_ = SUB84(x2_abs.m_data[0],0);
  local_1c8._4_4_ = (uint)((ulong)x2_abs.m_data[0] >> 0x20);
  local_1d8 = (ChVector<double> *)((double)local_208.m_value + Phi_pi1.m_data[2]);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,0);
  *pSVar14 = (Scalar)CONCAT44(local_1c8._4_4_,(uint)local_1c8);
  local_1c8._0_4_ = SUB84(x2_abs.m_data[1],0);
  local_1c8._4_4_ = (uint)((ulong)x2_abs.m_data[1] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,1);
  *pSVar14 = (Scalar)CONCAT44(local_1c8._4_4_,(uint)local_1c8);
  local_1c8._0_4_ = SUB84(x2_abs.m_data[2],0);
  local_1c8._4_4_ = (uint)((ulong)x2_abs.m_data[2] >> 0x20);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,2);
  *pSVar14 = (Scalar)CONCAT44(local_1c8._4_4_,(uint)local_1c8);
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,3);
  *pSVar14 = (Scalar)local_1b8;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,4);
  *pSVar14 = (Scalar)local_1b0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_218,pCVar15);
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_218,5);
  *pSVar14 = (Scalar)local_1d8;
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Update(double time, bool update_assets) {
    // Inherit time changes of parent class (ChLink)
    ChLink::UpdateTime(time);

    // Express the body locations and direction in absolute frame
    ChVector<> p1_abs = Body1->TransformPointLocalToParent(m_p1);
    ChVector<> p2_abs = Body2->TransformPointLocalToParent(m_p2);
    ChVector<> z1_abs = Body1->TransformDirectionLocalToParent(m_z1);
    ChVector<> x2_abs = Body2->TransformDirectionLocalToParent(m_x2);
    ChVector<> y2_abs = Body2->TransformDirectionLocalToParent(m_y2);
    ChVector<> d12_abs = p2_abs - p1_abs;

    // Update current constraint quantities
    m_cur_par1 = Vdot(z1_abs, x2_abs);
    m_cur_par2 = Vdot(z1_abs, y2_abs);
    m_cur_dot = Vdot(d12_abs, z1_abs);
    m_cur_dist = Vdot(d12_abs, x2_abs);

    // Calculate a few more quantities
    // (express directions on one body in the frame ot the other body)
    ChVector<> z1_2 = Body2->TransformDirectionParentToLocal(z1_abs);
    ChVector<> x2_1 = Body1->TransformDirectionParentToLocal(x2_abs);
    ChVector<> y2_1 = Body1->TransformDirectionParentToLocal(y2_abs);

    ChVector<> d12_1 = Body1->TransformDirectionParentToLocal(d12_abs);
    ChVector<> d12_2 = Body2->TransformDirectionParentToLocal(d12_abs);

    // First constraint (par1)
    {
        // Cache constraint violation
        m_C(0) = m_cur_par1;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, x2_1);

        m_cnstr_par1.Get_Cq_a()(0) = 0;
        m_cnstr_par1.Get_Cq_a()(1) = 0;
        m_cnstr_par1.Get_Cq_a()(2) = 0;

        m_cnstr_par1.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_par1.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_par1.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_x2, z1_2);

        m_cnstr_par1.Get_Cq_b()(0) = 0;
        m_cnstr_par1.Get_Cq_b()(1) = 0;
        m_cnstr_par1.Get_Cq_b()(2) = 0;

        m_cnstr_par1.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_par1.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_par1.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Second constraint (par2)
    {
        // Cache constraint violation
        m_C(1) = m_cur_par2;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, y2_1);

        m_cnstr_par2.Get_Cq_a()(0) = 0;
        m_cnstr_par2.Get_Cq_a()(1) = 0;
        m_cnstr_par2.Get_Cq_a()(2) = 0;

        m_cnstr_par2.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_par2.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_par2.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_y2, z1_2);

        m_cnstr_par2.Get_Cq_b()(0) = 0;
        m_cnstr_par2.Get_Cq_b()(1) = 0;
        m_cnstr_par2.Get_Cq_b()(2) = 0;

        m_cnstr_par2.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_par2.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_par2.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Third constraint (dot)
    {
        // Cache constraint violation
        m_C(2) = m_cur_dot;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, d12_1) - Vcross(m_p1, m_z1);

        m_cnstr_dot.Get_Cq_a()(0) = -z1_abs.x();
        m_cnstr_dot.Get_Cq_a()(1) = -z1_abs.y();
        m_cnstr_dot.Get_Cq_a()(2) = -z1_abs.z();

        m_cnstr_dot.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_dot.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_dot.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_p2, z1_2);

        m_cnstr_dot.Get_Cq_b()(0) = z1_abs.x();
        m_cnstr_dot.Get_Cq_b()(1) = z1_abs.y();
        m_cnstr_dot.Get_Cq_b()(2) = z1_abs.z();

        m_cnstr_dot.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_dot.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_dot.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Fourth constraint (dist)
    {
        // Cache constraint violation
        m_C(3) = m_cur_dist - m_dist;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = -Vcross(m_p1, x2_1);

        m_cnstr_dist.Get_Cq_a()(0) = -x2_abs.x();
        m_cnstr_dist.Get_Cq_a()(1) = -x2_abs.y();
        m_cnstr_dist.Get_Cq_a()(2) = -x2_abs.z();

        m_cnstr_dist.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_dist.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_dist.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_x2, d12_2) + Vcross(m_p2, m_x2);

        m_cnstr_dist.Get_Cq_b()(0) = x2_abs.x();
        m_cnstr_dist.Get_Cq_b()(1) = x2_abs.y();
        m_cnstr_dist.Get_Cq_b()(2) = x2_abs.z();

        m_cnstr_dist.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_dist.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_dist.Get_Cq_b()(5) = Phi_pi2.z();
    }
}